

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  uint uVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  code *in_R8;
  undefined8 in_R9;
  uchar y [32];
  uchar x [32];
  secp256k1_scalar s;
  secp256k1_ge pt;
  secp256k1_gej res;
  int overflow;
  int ret;
  secp256k1_scalar *in_stack_00000ae0;
  secp256k1_ge *in_stack_00000ae8;
  secp256k1_gej *in_stack_00000af0;
  secp256k1_pubkey *in_stack_fffffffffffffe88;
  secp256k1_ge *in_stack_fffffffffffffe90;
  secp256k1_context *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  secp256k1_scalar *in_stack_fffffffffffffea8;
  secp256k1_scalar *in_stack_fffffffffffffeb0;
  secp256k1_gej *in_stack_fffffffffffffed8;
  secp256k1_ge *in_stack_fffffffffffffee0;
  secp256k1_fe local_118;
  secp256k1_fe asStack_f0 [4];
  uint local_40;
  int local_3c;
  undefined8 local_38;
  code *local_30;
  long local_18;
  uint local_4;
  
  local_3c = 0;
  local_40 = 0;
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88);
    local_4 = 0;
  }
  else {
    local_30 = in_R8;
    if (in_R8 == (code *)0x0) {
      local_30 = ecdh_hash_function_sha256;
    }
    local_38 = in_R9;
    local_18 = in_RSI;
    secp256k1_pubkey_load
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (uchar *)in_stack_fffffffffffffe98,(int *)in_stack_fffffffffffffe90);
    uVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x106961);
    local_40 = uVar1 | local_40;
    secp256k1_scalar_cmov
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    secp256k1_ecmult_const(in_stack_00000af0,in_stack_00000ae8,in_stack_00000ae0);
    secp256k1_ge_set_gej(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    secp256k1_fe_impl_normalize(&local_118);
    secp256k1_fe_impl_normalize(asStack_f0);
    secp256k1_fe_impl_get_b32(&stack0xfffffffffffffea8,&local_118);
    secp256k1_fe_impl_get_b32(&stack0xfffffffffffffe88,asStack_f0);
    local_3c = (*local_30)(local_18,&stack0xfffffffffffffea8,&stack0xfffffffffffffe88,local_38);
    secp256k1_memclear(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    secp256k1_memclear(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    secp256k1_scalar_clear((secp256k1_scalar *)0x106a37);
    secp256k1_ge_clear((secp256k1_ge *)0x106a41);
    secp256k1_gej_clear((secp256k1_gej *)0x106a4e);
    local_4 = (uint)(local_3c != 0 & (local_40 != 0 ^ 0xffU) & 1);
  }
  return local_4;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    secp256k1_memclear(x, sizeof(x));
    secp256k1_memclear(y, sizeof(y));
    secp256k1_scalar_clear(&s);
    secp256k1_ge_clear(&pt);
    secp256k1_gej_clear(&res);

    return !!ret & !overflow;
}